

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O3

void OpenSteer::drawXZCheckerboardGrid
               (float size,int subsquares,Vec3 *center,Color *color1,Color *color2)

{
  PFNGLCOLOR3FPROC p_Var1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *extraout_RDX;
  void *pvVar5;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  int iVar6;
  Vec3 *pVVar7;
  char *in_R8;
  int in_R9D;
  Color *this;
  GLfloat extraout_XMM0_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int in_stack_ffffffffffffff78;
  float local_74;
  
  iVar4 = (int)color2;
  pVVar7 = center;
  (*glad_glPushAttrib)(0x2000);
  (*glad_glDisable)(0xb44);
  if (0 < subsquares) {
    fVar12 = size / (float)subsquares;
    fVar10 = size * -0.5;
    uVar3 = 0;
    pvVar5 = extraout_RDX;
    fVar11 = fVar10;
    iVar6 = subsquares;
    local_74 = fVar10;
    uVar2 = uVar3;
    do {
      do {
        fVar13 = center->x + local_74;
        fVar14 = center->y + 0.0;
        fVar15 = center->z + fVar11;
        this = color2;
        if ((uVar3 & 1) != 0) {
          this = color1;
        }
        if (updatePhaseActive == '\x01') {
          warnIfInUpdatePhase2("iDrawQuadrangle");
          pvVar5 = extraout_RDX_00;
        }
        p_Var1 = glad_glColor3f;
        Color::r(this,pVVar7,pvVar5,iVar4,in_R8,in_R9D,in_stack_ffffffffffffff78);
        fVar8 = Color::g(this);
        fVar9 = Color::b(this);
        (*p_Var1)(extraout_XMM0_Da,fVar8,fVar9);
        (*glad_glBegin)(7);
        (*glad_glVertex3f)(fVar13,fVar14,fVar15);
        (*glad_glVertex3f)(fVar12 + fVar13,fVar14,fVar15 + 0.0);
        (*glad_glVertex3f)(fVar12 + fVar13,fVar14,fVar12 + fVar15);
        (*glad_glVertex3f)(fVar13 + 0.0,fVar14,fVar12 + fVar15);
        (*glad_glEnd)();
        uVar3 = (uint)(byte)((byte)uVar3 ^ 1);
        iVar6 = iVar6 + -1;
        pvVar5 = extraout_RDX_01;
        fVar11 = fVar11 + fVar12;
      } while (iVar6 != 0);
      uVar3 = uVar2 + 1;
      local_74 = local_74 + fVar12;
      fVar11 = fVar10;
      iVar6 = subsquares;
      uVar2 = uVar3;
    } while (uVar3 != subsquares);
  }
  (*glad_glPopAttrib)();
  return;
}

Assistant:

void 
OpenSteer::drawXZCheckerboardGrid (const float size,
                                   const int subsquares,
                                   const Vec3& center,
                                   const Color& color1,
                                   const Color& color2)
{
    const float half = size/2;
    const float spacing = size / subsquares;

    beginDoubleSidedDrawing ();
    {
        bool flag1 = false;
        float p = -half;
        Vec3 corner;
        for (int i = 0; i < subsquares; i++)
        {
            bool flag2 = flag1;
            float q = -half;
            for (int j = 0; j < subsquares; j++)
            {
                corner.set (p, 0, q);
                corner += center;
                iDrawQuadrangle (corner,
                                 corner + Vec3 (spacing, 0,       0),
                                 corner + Vec3 (spacing, 0, spacing),
                                 corner + Vec3 (0,       0, spacing),
                                 flag2 ? color1 : color2);
                flag2 = !flag2;
                q += spacing;
            }
            flag1 = !flag1;
            p += spacing;
        }
    }
    endDoubleSidedDrawing ();
}